

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatienceSort.h
# Opt level: O0

void __thiscall
PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>::
GenerateRuns(PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
             *this,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
            __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
            vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *runs)

{
  RunPool<int> *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  difference_type dVar4;
  size_t s;
  reference piVar5;
  iterator iVar6;
  size_type sVar7;
  reference ppRVar8;
  reference pvVar9;
  ulong uVar10;
  double dVar11;
  float local_10c;
  size_t i_1;
  RunPool<int> *run;
  int *local_d8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_d0;
  int *local_c8;
  int *local_c0;
  int *local_b8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> next_value;
  size_t i;
  int *local_80;
  int *local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> key;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_60;
  ValueType value;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> it;
  vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_> *runs_local;
  PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *this_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  this_local = (PatienceSorting<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
                *)end._M_current;
  end_local = begin;
  std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::clear(runs);
  dVar4 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (end_local,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this_local);
  this->num_elements_ = dVar4;
  dVar11 = sqrt((double)this->num_elements_);
  this->num_runs_ = (long)dVar11 | (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f;
  iVar3 = GetOrderLevel(this,end_local,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        this_local);
  this->values_not_in_order_ = iVar3;
  this->sortedness_ = (float)this->values_not_in_order_ / (float)this->num_elements_;
  if (this->sortedness_ <= 0.35) {
    local_10c = (float)this->num_runs_;
    uVar10 = (ulong)(local_10c * 1.5);
    SetMemSize(uVar10 | (long)(local_10c * 1.5 - 9.223372e+18) & (long)uVar10 >> 0x3f);
    Init();
    s = GetMemPoolSize(this,this->num_elements_,this->num_runs_);
    RunPool<int>::SetMemSize(s);
    RunPool<int>::Init();
    std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::reserve(runs,this->num_runs_);
    std::vector<int,_std::allocator<int>_>::reserve(&this->lasts_,this->num_elements_);
    std::vector<int,_std::allocator<int>_>::reserve(&this->heads_,this->num_elements_);
    _Stack_60._M_current = end_local._M_current;
    while (bVar1 = __gnu_cxx::operator!=
                             (&stack0xffffffffffffffa0,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &this_local), bVar1) {
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&stack0xffffffffffffffa0);
      key._M_current._4_4_ = *piVar5;
      local_78 = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->lasts_);
      local_80 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->lasts_);
      local_70 = std::
                 lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,PatienceSorting<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>::GenerateRuns(__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::vector<RunPool<int>*,std::allocator<RunPool<int>*>>&)::_lambda(int&,int)_1_>
                           (local_78,local_80,(undefined1 *)((long)&key._M_current + 4));
      i = (size_t)std::vector<int,_std::allocator<int>_>::end(&this->lasts_);
      bVar1 = __gnu_cxx::operator!=
                        (&local_70,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
      if (bVar1) {
        iVar6 = std::vector<int,_std::allocator<int>_>::begin(&this->lasts_);
        next_value._M_current = local_70._M_current;
        sVar7 = std::
                distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                          ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                           iVar6._M_current,local_70);
        ppRVar8 = std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::operator[]
                            (runs,sVar7);
        RunPool<int>::Add(*ppRVar8,(int *)((long)&key._M_current + 4));
        iVar3 = key._M_current._4_4_;
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->lasts_,sVar7);
        *pvVar9 = iVar3;
        if (sVar7 == 0) {
          local_b8 = _Stack_60._M_current;
          local_b0 = std::
                     next<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                               (_Stack_60,1);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&local_b0,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               &this_local);
            bVar1 = false;
            if (bVar2) {
              piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                       ::operator*(&local_b0);
              iVar3 = *piVar5;
              pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->lasts_,0);
              bVar1 = *pvVar9 < iVar3;
            }
            if (!bVar1) break;
            local_c0 = (int *)__gnu_cxx::
                              __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                              operator++(&stack0xffffffffffffffa0,0);
            ppRVar8 = std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::operator[]
                                (runs,0);
            this_00 = *ppRVar8;
            piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&stack0xffffffffffffffa0);
            RunPool<int>::Add(this_00,piVar5);
            piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&stack0xffffffffffffffa0);
            iVar3 = *piVar5;
            pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->lasts_,0);
            *pvVar9 = iVar3;
          }
        }
      }
      else {
        local_d0._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->heads_);
        local_d8 = (int *)std::vector<int,_std::allocator<int>_>::end(&this->heads_);
        local_c8 = (int *)std::
                          lower_bound<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                                    (local_d0,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                               )local_d8,(int *)((long)&key._M_current + 4));
        local_70 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_c8;
        run = (RunPool<int> *)std::vector<int,_std::allocator<int>_>::end(&this->heads_);
        bVar1 = __gnu_cxx::operator==
                          (&local_70,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&run
                          );
        if (bVar1) {
          i_1 = (size_t)Alloc();
          RunPool<int>::RunPool((RunPool<int> *)i_1);
          std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::push_back
                    (runs,(value_type *)&i_1);
          ppRVar8 = std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::back(runs);
          RunPool<int>::Add(*ppRVar8,(int *)((long)&key._M_current + 4));
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this->lasts_,(value_type *)((long)&key._M_current + 4));
          std::vector<int,_std::allocator<int>_>::push_back
                    (&this->heads_,(value_type *)((long)&key._M_current + 4));
        }
        else {
          iVar6 = std::vector<int,_std::allocator<int>_>::begin(&this->heads_);
          sVar7 = std::
                  distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                             iVar6._M_current,local_70);
          ppRVar8 = std::vector<RunPool<int>_*,_std::allocator<RunPool<int>_*>_>::operator[]
                              (runs,sVar7);
          RunPool<int>::AddFront(*ppRVar8,(int *)((long)&key._M_current + 4));
          iVar3 = key._M_current._4_4_;
          pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&this->heads_,sVar7);
          *pvVar9 = iVar3;
        }
      }
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&stack0xffffffffffffffa0);
    }
  }
  else {
    it._M_current = (int *)this_local;
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (end_local,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)this_local);
  }
  return;
}

Assistant:

void GenerateRuns(RAI begin, RAI end, std::vector<RunPool<ValueType>*>& runs) {
        runs.clear();
        num_elements_ = std::distance(begin, end);
        num_runs_ = static_cast<size_t>(sqrt(num_elements_));

        // calculate the degree of disorder
        values_not_in_order_ = GetOrderLevel(begin, end);
        sortedness_ = values_not_in_order_ / static_cast<float>(num_elements_);

        // fallback to std::sort if input data is too random
        if(sortedness_ > kMaxSortedness) {
            std::sort(begin, end);
            return;
        }

        // Pool for runs
        SetMemSize(num_runs_ * kRunPoolSize);
        Init();

        // Pool for runblocks
        RunPool<ValueType>::SetMemSize(GetMemPoolSize(num_elements_, num_runs_));
        RunPool<ValueType>::Init();


        runs.reserve(num_runs_);
        lasts_.reserve(num_elements_);
        heads_.reserve(num_elements_);

        for (auto it = begin; it != end; ++it) {

            // binary search the right run to insert the current element
            ValueType value = *it;
            auto key = std::lower_bound(lasts_.begin(), lasts_.end(), value, [](ValueType& v1, ValueType v2) { return v1 > v2;});

            if (key != lasts_.end()) {      // if suitable run is found, append
                size_t i = std::distance(lasts_.begin(), key);
                runs[i]->Add(value);
                lasts_[i] = value;

                // if we add to the first run, try to add as many elements as possible to avoid expensive binary search
                if (i == 0) {
                    auto next_value = std::next(it, 1);
                    while (next_value != end
                           && *next_value > lasts_[i]) {
                        it++;
                        runs[0]->Add(*it);
                        lasts_[0] = *it;
                    }
                }
            }
            else {      // no suitable run found, so we try to add the element to the begin of a run

                // binary search the beginnings to find a suitable run
                key = std::lower_bound(heads_.begin(), heads_.end(), value);
                if (key == heads_.end()) {      // no suitable run found, create a new run and add it to sorted runs vector

                    RunPool<ValueType>* run = Alloc();
                    new(run) RunPool<ValueType>();      // necessary, otherwise the objects are not initialized -> memory error
                    runs.push_back(run);

                    runs.back()->Add(value);
                    lasts_.push_back(value);
                    heads_.push_back(value);
                } else {
                    // suitable run found, so append to its beginning.
                    size_t i = std::distance(heads_.begin(), key);
                    runs[i]->AddFront(value);
                    heads_[i] = value;
                }
            }
        }
    }